

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guild.cpp
# Opt level: O0

void __thiscall Guild::SetMemberRank(Guild *this,string *name,int rank)

{
  World *pWVar1;
  uint uVar2;
  bool bVar3;
  __type _Var4;
  element_type *peVar5;
  list<Client_*,_std::allocator<Client_*>_> *this_00;
  reference ppCVar6;
  vector<Character_*,_std::allocator<Character_*>_> *this_01;
  reference ppCVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Database_Result local_f8;
  int local_d4;
  Character *local_d0;
  Character *character;
  iterator __end4;
  iterator __begin4;
  vector<Character_*,_std::allocator<Character_*>_> *__range4;
  EOClient *eoclient;
  Client *client;
  iterator __end2;
  iterator __begin2;
  list<Client_*,_std::allocator<Client_*>_> *__range2;
  World *world;
  string rank_str;
  string local_50 [32];
  undefined1 local_30 [8];
  shared_ptr<Guild_Member> member;
  int rank_local;
  string *name_local;
  Guild *this_local;
  
  member.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = rank
  ;
  std::__cxx11::string::string(local_50,(string *)name);
  GetMember((Guild *)local_30,(string *)this);
  std::__cxx11::string::~string(local_50);
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar3) {
    GetRank_abi_cxx11_((string *)&world,this,
                       member.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._4_4_);
    uVar2 = member.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_;
    peVar5 = std::__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    peVar5->rank = uVar2;
    peVar5 = std::__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Guild_Member,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    std::__cxx11::string::operator=((string *)&peVar5->rank_string,(string *)&world);
    pWVar1 = this->manager->world;
    this_00 = &(pWVar1->server->super_Server).clients;
    __end2 = std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::begin(this_00);
    client = (Client *)std::__cxx11::list<Client_*,_std::allocator<Client_*>_>::end(this_00);
    while (bVar3 = std::operator!=(&__end2,(_Self *)&client),
          uVar2 = member.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._4_4_, bVar3) {
      ppCVar6 = std::_List_iterator<Client_*>::operator*(&__end2);
      if ((*ppCVar6)[1].send_buffer.super__Hash_node_base._M_nxt != (_Hash_node_base *)0x0) {
        this_01 = (vector<Character_*,_std::allocator<Character_*>_> *)
                  ((*ppCVar6)[1].send_buffer.super__Hash_node_base._M_nxt + 10);
        __end4 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(this_01);
        character = (Character *)
                    std::vector<Character_*,_std::allocator<Character_*>_>::end(this_01);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                           *)&character), bVar3) {
          ppCVar7 = __gnu_cxx::
                    __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                    ::operator*(&__end4);
          local_d0 = *ppCVar7;
          _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_d0->real_name,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)name);
          if (_Var4) {
            local_d0->guild_rank =
                 member.super___shared_ptr<Guild_Member,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._4_1_;
            std::__cxx11::string::operator=((string *)&local_d0->guild_rank_string,(string *)&world)
            ;
            if ((local_d0->online & 1U) != 0) {
              local_d4 = 1;
              goto LAB_00299fb4;
            }
            break;
          }
          __gnu_cxx::
          __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
          operator++(&__end4);
        }
      }
      std::_List_iterator<Client_*>::operator++(&__end2);
    }
    uVar8 = std::__cxx11::string::c_str();
    uVar9 = std::__cxx11::string::c_str();
    Database::Query(&local_f8,&pWVar1->db,
                    "UPDATE `characters` SET `guild_rank` = #, `guild_rank_string` = \'$\' WHERE `name` = \'$\'"
                    ,(ulong)uVar2,uVar8,uVar9);
    Database_Result::~Database_Result(&local_f8);
    local_d4 = 0;
LAB_00299fb4:
    std::__cxx11::string::~string((string *)&world);
    if (local_d4 != 0) goto LAB_00299fd5;
  }
  local_d4 = 0;
LAB_00299fd5:
  std::shared_ptr<Guild_Member>::~shared_ptr((shared_ptr<Guild_Member> *)local_30);
  return;
}

Assistant:

void Guild::SetMemberRank(std::string name, int rank)
{
	std::shared_ptr<Guild_Member> member = this->GetMember(name);

	if (member)
	{
		std::string rank_str = this->GetRank(rank);

		member->rank = rank;
		member->rank_string = rank_str;

		World* world = this->manager->world;

		UTIL_FOREACH(world->server->clients, client)
		{
			EOClient *eoclient = static_cast<EOClient *>(client);

			if (eoclient->player)
			{
				UTIL_FOREACH(eoclient->player->characters, character)
				{
					if (character->real_name == name)
					{
						character->guild_rank = rank;
						character->guild_rank_string = rank_str;
						
						if (character->online)
							return;
						else
							break;
					}
				}
			}
		}

		world->db.Query("UPDATE `characters` SET `guild_rank` = #, `guild_rank_string` = '$' WHERE `name` = '$'",
			rank, rank_str.c_str(), name.c_str());
	}
}